

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Select *p;
  bool bVar1;
  int iVar2;
  int iVar3;
  RenameToken *pToken_2;
  char *pcVar4;
  char *zDatabase;
  char *zName;
  i64 iVar5;
  char *pcVar6;
  i64 iVar7;
  Table *pTVar8;
  Table *pTVar9;
  RenameToken **ppRVar10;
  RenameToken *pRVar11;
  RenameToken *pRVar12;
  RenameToken *pToken;
  RenameToken **ppRVar13;
  TriggerStep *pTVar14;
  FKey *pFVar15;
  sqlite3_context *pCtx;
  uint uVar16;
  Index *pIVar17;
  long lVar18;
  sqlite3_xauth p_Var19;
  sqlite3 *db;
  bool bVar20;
  bool bVar21;
  RenameCtx sCtx;
  Parse sParse;
  RenameToken *local_278;
  int local_270;
  RenameCtx local_268;
  sqlite3 *local_240;
  sqlite3_value **local_238;
  sqlite3_xauth local_230;
  sqlite3_context *local_228;
  char *local_220;
  char *local_218;
  i64 local_210;
  char *local_208;
  i64 local_200;
  Walker local_1f8;
  Parse local_1c8;
  
  db = context->pOut->db;
  local_228 = context;
  pcVar4 = (char *)sqlite3ValueText(*argv,'\x01');
  zDatabase = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  iVar5 = sqlite3VdbeIntValue(argv[5]);
  pcVar6 = (char *)sqlite3ValueText(argv[6],'\x01');
  local_210 = sqlite3VdbeIntValue(argv[7]);
  iVar7 = sqlite3VdbeIntValue(argv[8]);
  uVar16 = (uint)iVar5;
  if (((int)uVar16 < 0 || pcVar6 == (char *)0x0) || (zName == (char *)0x0 || pcVar4 == (char *)0x0))
  {
    return;
  }
  p_Var19 = db->xAuth;
  local_218 = pcVar4;
  local_208 = pcVar6;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pTVar8 = sqlite3FindTable(db,zName,zDatabase);
  if ((pTVar8 == (Table *)0x0) || ((int)pTVar8->nCol <= (int)uVar16)) {
    if (db->noSharedCache != '\0') {
      return;
    }
    btreeLeaveAll(db);
    return;
  }
  local_220 = pTVar8->aCol[uVar16 & 0x7fffffff].zName;
  local_268.pTab = (Table *)0x0;
  local_268.zOld = (char *)0x0;
  local_268.pList = (RenameToken *)0x0;
  local_268.iCol = 0xffffffff;
  if (uVar16 != (int)pTVar8->iPKey) {
    local_268.iCol = uVar16;
  }
  local_268.nList = 0;
  db->xAuth = (sqlite3_xauth)0x0;
  local_238 = argv;
  local_230 = p_Var19;
  iVar2 = renameParseSql(&local_1c8,zDatabase,0,db,local_218,(int)iVar7);
  pTVar9 = local_1c8.pNewTable;
  local_1f8.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_1f8.walkerDepth = 0;
  local_1f8.eCode = '\0';
  local_1f8._37_3_ = 0;
  local_1f8.pParse = &local_1c8;
  local_1f8.xExprCallback = renameColumnExprCb;
  local_1f8.xSelectCallback = renameColumnSelectCb;
  pCtx = local_228;
  local_268.pTab = pTVar8;
  local_1f8.u.pNC = (NameContext *)&local_268;
  if (iVar2 == 0) {
    if (local_1c8.pNewTable == (Table *)0x0) {
      if (local_1c8.pNewIndex == (Index *)0x0) {
        pcVar4 = (char *)0x0;
        if ((int)iVar7 == 0) {
          pcVar4 = zDatabase;
        }
        iVar2 = renameResolveTrigger(&local_1c8,pcVar4);
        pcVar4 = local_220;
        pCtx = local_228;
        if (iVar2 != 0) goto LAB_0019005c;
        pTVar14 = (local_1c8.pNewTrigger)->step_list;
        if (pTVar14 != (TriggerStep *)0x0) {
          do {
            if ((pTVar14->zTarget != (char *)0x0) &&
               (pTVar9 = sqlite3LocateTable(&local_1c8,0,pTVar14->zTarget,zDatabase),
               pTVar9 == pTVar8)) {
              if (pTVar14->pUpsert != (Upsert *)0x0) {
                renameColumnElistNames(&local_1c8,&local_268,pTVar14->pUpsert->pUpsertSet,pcVar4);
              }
              renameColumnIdlistNames(&local_1c8,&local_268,pTVar14->pIdList,pcVar4);
              renameColumnElistNames(&local_1c8,&local_268,pTVar14->pExprList,pcVar4);
            }
            pTVar14 = pTVar14->pNext;
          } while (pTVar14 != (TriggerStep *)0x0);
        }
        local_240 = db;
        if (local_1c8.pTriggerTab == pTVar8) {
          renameColumnIdlistNames(&local_1c8,&local_268,(local_1c8.pNewTrigger)->pColumns,pcVar4);
        }
        renameWalkTrigger(&local_1f8,local_1c8.pNewTrigger);
      }
      else {
        local_240 = db;
        sqlite3WalkExprList(&local_1f8,(local_1c8.pNewIndex)->aColExpr);
        if ((local_1c8.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
          walkExpr(&local_1f8,(local_1c8.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else {
      p = (local_1c8.pNewTable)->pSelect;
      if (p == (Select *)0x0) {
        local_200 = iVar5;
        if ((local_1c8.pNewTable)->zName == (char *)0x0) {
          local_268.pTab = local_1c8.pNewTable;
          bVar1 = false;
          local_1c8.pNewTable = pTVar9;
          local_240 = db;
        }
        else {
          local_240 = db;
          iVar2 = sqlite3StrICmp(zName,(local_1c8.pNewTable)->zName);
          local_268.pTab = pTVar9;
          if (iVar2 == 0) {
            ppRVar10 = &local_1c8.pRename;
            if (local_1c8.pRename != (RenameToken *)0x0) {
              pcVar4 = pTVar9->aCol[uVar16 & 0x7fffffff].zName;
              pRVar12 = local_1c8.pRename;
              ppRVar13 = ppRVar10;
              if ((char *)(local_1c8.pRename)->p != pcVar4) {
                do {
                  pRVar11 = pRVar12;
                  pRVar12 = pRVar11->pNext;
                  if (pRVar12 == (RenameToken *)0x0) goto LAB_0018fe06;
                } while ((char *)pRVar12->p != pcVar4);
                ppRVar13 = &pRVar11->pNext;
              }
              *ppRVar13 = pRVar12->pNext;
              pRVar12->pNext = local_268.pList;
              local_268.nList = local_268.nList + 1;
              pTVar9 = local_1c8.pNewTable;
              local_268.pList = pRVar12;
            }
LAB_0018fe06:
            if ((local_268.iCol < 0) && (local_1c8.pRename != (RenameToken *)0x0)) {
              pRVar12 = local_1c8.pRename;
              if ((i16 *)(local_1c8.pRename)->p != &pTVar9->iPKey) {
                do {
                  pRVar11 = pRVar12;
                  pRVar12 = pRVar11->pNext;
                  if (pRVar12 == (RenameToken *)0x0) goto LAB_0018fe59;
                } while ((i16 *)pRVar12->p != &pTVar9->iPKey);
                ppRVar10 = &pRVar11->pNext;
              }
              *ppRVar10 = pRVar12->pNext;
              pRVar12->pNext = local_268.pList;
              local_268.nList = local_268.nList + 1;
              pTVar9 = local_1c8.pNewTable;
              local_268.pList = pRVar12;
            }
LAB_0018fe59:
            sqlite3WalkExprList(&local_1f8,pTVar9->pCheck);
            pIVar17 = (local_1c8.pNewTable)->pIndex;
            bVar1 = true;
            if (pIVar17 != (Index *)0x0) {
              do {
                sqlite3WalkExprList(&local_1f8,pIVar17->aColExpr);
                pIVar17 = pIVar17->pNext;
              } while (pIVar17 != (Index *)0x0);
            }
          }
          else {
            bVar1 = false;
            local_1c8.pNewTable = pTVar9;
          }
        }
        pFVar15 = (local_1c8.pNewTable)->pFKey;
        if (pFVar15 != (FKey *)0x0) {
          bVar20 = local_220 != (char *)0x0;
          local_270 = local_268.nList;
          local_278 = local_268.pList;
          do {
            iVar2 = pFVar15->nCol;
            if (0 < (long)iVar2) {
              lVar18 = 0;
              do {
                if ((bVar1) &&
                   (local_1c8.pRename != (RenameToken *)0x0 &&
                    pFVar15->aCol[lVar18].iFrom == (int)local_200)) {
                  ppRVar10 = &local_1c8.pRename;
                  pRVar12 = local_1c8.pRename;
                  if ((sColMap *)(local_1c8.pRename)->p != pFVar15->aCol + lVar18) {
                    do {
                      pRVar11 = pRVar12;
                      pRVar12 = pRVar11->pNext;
                      if (pRVar12 == (RenameToken *)0x0) goto LAB_0018ff62;
                    } while ((sColMap *)pRVar12->p != pFVar15->aCol + lVar18);
                    ppRVar10 = &pRVar11->pNext;
                  }
                  *ppRVar10 = pRVar12->pNext;
                  pRVar12->pNext = local_278;
                  local_268.nList = local_270 + 1;
                  local_278 = pRVar12;
                  local_268.pList = pRVar12;
                  local_270 = local_268.nList;
                }
LAB_0018ff62:
                if ((pFVar15->zTo != (char *)0x0) &&
                   (iVar3 = sqlite3StrICmp(pFVar15->zTo,zName), iVar3 == 0)) {
                  pcVar4 = pFVar15->aCol[lVar18].zCol;
                  bVar21 = bVar20;
                  if (pcVar4 != (char *)0x0) {
                    if (local_220 == (char *)0x0) goto LAB_0019000c;
                    iVar3 = sqlite3StrICmp(pcVar4,local_220);
                    bVar21 = iVar3 != 0;
                  }
                  if (local_1c8.pRename != (RenameToken *)0x0 && !bVar21) {
                    ppRVar10 = &local_1c8.pRename;
                    pRVar12 = local_1c8.pRename;
                    if ((char *)(local_1c8.pRename)->p != pcVar4) {
                      do {
                        pRVar11 = pRVar12;
                        pRVar12 = pRVar11->pNext;
                        if (pRVar12 == (RenameToken *)0x0) goto LAB_0019000c;
                      } while ((char *)pRVar12->p != pcVar4);
                      ppRVar10 = &pRVar11->pNext;
                    }
                    *ppRVar10 = pRVar12->pNext;
                    pRVar12->pNext = local_278;
                    local_268.nList = local_270 + 1;
                    local_278 = pRVar12;
                    local_268.pList = pRVar12;
                    local_270 = local_268.nList;
                  }
                }
LAB_0019000c:
                lVar18 = lVar18 + 1;
              } while (lVar18 != iVar2);
            }
            pFVar15 = pFVar15->pNextFrom;
          } while (pFVar15 != (FKey *)0x0);
        }
      }
      else {
        local_1c8.rc = 0;
        sqlite3SelectPrep(&local_1c8,p,(NameContext *)0x0);
        iVar2 = 7;
        if (db->mallocFailed == '\0') {
          iVar2 = local_1c8.rc;
        }
        pCtx = local_228;
        if (iVar2 != 0) goto LAB_0019005c;
        local_240 = db;
        sqlite3WalkSelect(&local_1f8,p);
      }
    }
    pCtx = local_228;
    iVar2 = renameEditSql(local_228,&local_268,local_218,local_208,(int)local_210);
    p_Var19 = local_230;
    db = local_240;
    if (iVar2 == 0) goto LAB_0019008d;
  }
LAB_0019005c:
  p_Var19 = local_230;
  if (local_1c8.zErrMsg == (char *)0x0) {
    sqlite3_result_error_code(pCtx,iVar2);
  }
  else {
    renameColumnParseError(pCtx,0,local_238[1],local_238[2],&local_1c8);
  }
LAB_0019008d:
  renameParseCleanup(&local_1c8);
  pRVar12 = local_268.pList;
  while (pRVar12 != (RenameToken *)0x0) {
    pRVar11 = pRVar12->pNext;
    sqlite3DbFreeNN(db,pRVar12);
    pRVar12 = pRVar11;
  }
  db->xAuth = p_Var19;
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}